

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O1

char * GetPath(char *filename)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  sVar2 = strlen(filename);
  uVar4 = (uint)sVar2;
  uVar3 = sVar2 & 0xffffffff;
  uVar5 = uVar4 + 1;
  do {
    uVar6 = (int)uVar4 >> 0x1f & uVar4;
    if ((int)uVar3 < 1) break;
    uVar5 = uVar5 - 1;
    lVar1 = uVar3 - 1;
    uVar3 = uVar3 - 1;
    uVar6 = uVar5;
  } while (filename[lVar1] != '/');
  if ((int)uVar6 < 1) {
    GetPath::curpath[2] = '\0';
    GetPath::curpath[0] = '.';
    GetPath::curpath[1] = '/';
  }
  else {
    strcpy(GetPath::curpath,filename);
    GetPath::curpath[uVar6] = '\0';
  }
  return GetPath::curpath;
}

Assistant:

char *GetPath(char *filename) {
	#undef FUNC
	#define FUNC "GetPath"

	static char curpath[PATH_MAX];
	int zelen,idx;

	zelen=strlen(filename);

#ifdef OS_WIN
	#define CURRENT_DIR ".\\"

	TxtReplace(filename,"/","\\",1);
	idx=zelen-1;
	while (idx>=0 && filename[idx]!='\\') idx--;
	if (idx<0) {
		/* pas de chemin */
		strcpy(curpath,".\\");
	} else {
		/* chemin trouve */
		strcpy(curpath,filename);
		curpath[idx+1]=0;
	}
#else
#ifdef __MORPHOS__
	#define CURRENT_DIR ""
#else
	#define CURRENT_DIR "./"
#endif
	idx=zelen-1;
	while (idx>=0 && filename[idx]!='/') idx--;
	if (idx<0) {
		/* pas de chemin */
		strcpy(curpath,CURRENT_DIR);
	} else {
		/* chemin trouve */
		strcpy(curpath,filename);
		curpath[idx+1]=0;
	}
#endif

	return curpath;
}